

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  EVP_MD *pEVar7;
  EVP_MD *pEVar8;
  char *pcVar9;
  char *pcVar10;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  long lVar11;
  EVP_CIPHER_CTX *out;
  int arg;
  ulong uVar12;
  undefined8 *puVar13;
  uint *puVar14;
  EVP_MD *pEVar15;
  EVP_MD *unaff_R12;
  testcase_cipher *ptVar16;
  testcase_digest *ptVar17;
  EVP_CIPHER *pEVar18;
  EVP_MD *pEVar19;
  EVP_CIPHER_CTX *ctx_00;
  undefined8 uStack_598;
  uint uStack_590;
  int iStack_58c;
  EVP_CIPHER *pEStack_588;
  uchar auStack_580 [48];
  EVP_CIPHER *pEStack_550;
  undefined8 uStack_548;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined8 uStack_528;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  uchar auStack_420 [32];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  uchar auStack_320 [264];
  uchar *puStack_218;
  EVP_MD *pEStack_210;
  testcase_digest *ptStack_208;
  EVP_MD *pEStack_200;
  char *pcStack_1f8;
  EVP_MD *pEStack_1f0;
  ulong local_1e8;
  undefined1 local_1e0 [8];
  uchar K [32];
  uchar b [64];
  uchar c [64];
  uchar pt [256];
  
  uVar12 = 0;
  pEStack_1f0 = (EVP_MD *)0x1023f9;
  OPENSSL_init_crypto(0x4c,0);
  pEVar15 = (EVP_MD *)0x1;
  for (ptVar16 = testcases_ciphers; pcVar10 = ptVar16->name, pcVar10 != (char *)0x0;
      ptVar16 = ptVar16 + 1) {
    iVar5 = ptVar16->acpkm;
    pEStack_1f0 = (EVP_MD *)0x10241d;
    uVar3 = test_contexts_cipher(pcVar10,1,iVar5);
    unaff_R12 = (EVP_MD *)(ulong)uVar3;
    pEStack_1f0 = (EVP_MD *)0x10242d;
    uVar4 = test_contexts_cipher(pcVar10,0,iVar5);
    uVar12 = (ulong)((uint)uVar12 | uVar4 | uVar3);
  }
  ptVar17 = testcases_digests;
  pEVar19 = (EVP_MD *)0x0;
  local_1e8 = uVar12;
  do {
    pcVar10 = ptVar17->name;
    if (pcVar10 == (char *)0x0) {
      iVar5 = (int)local_1e8;
      pcVar10 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (iVar5 == 0) {
        pcVar10 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      pEStack_1f0 = (EVP_MD *)0x10273a;
      puts(pcVar10);
      return iVar5;
    }
    if (ptVar17->mac == 0) {
      pEStack_1f0 = (EVP_MD *)0x1024b0;
      ERR_set_mark();
      pEStack_1f0 = (EVP_MD *)0x1024b8;
      pEVar7 = EVP_get_digestbyname(pcVar10);
      if (pEVar7 == (EVP_MD *)0x0) {
        pEStack_1f0 = (EVP_MD *)0x1024c9;
        pEVar7 = (EVP_MD *)EVP_MD_fetch(0,pcVar10,0);
        if (pEVar7 == (EVP_MD *)0x0) goto LAB_001028ad;
      }
      pEStack_1f0 = (EVP_MD *)0x1024da;
      ERR_pop_to_mark();
      pEStack_1f0 = (EVP_MD *)0x1024eb;
      printf("\x1b[1;34mDigest test for %s\x1b[m\n");
      pEStack_1f0 = (EVP_MD *)0x1024f5;
      uVar3 = test_contexts_digest_or_legacy_mac((EVP_MD *)pEVar7,0);
      pEStack_1f0 = (EVP_MD *)0x102500;
      EVP_MD_free(pEVar7);
    }
    else {
      K[0x10] = '\0';
      K[0x11] = '\0';
      K[0x12] = '\0';
      K[0x13] = '\0';
      K[0x14] = '\0';
      K[0x15] = '\0';
      K[0x16] = '\0';
      K[0x17] = '\0';
      K[0x18] = '\0';
      K[0x19] = '\0';
      K[0x1a] = '\0';
      K[0x1b] = '\0';
      K[0x1c] = '\0';
      K[0x1d] = '\0';
      K[0x1e] = '\0';
      K[0x1f] = '\0';
      K[0] = '\x01';
      K[1] = '\0';
      K[2] = '\0';
      K[3] = '\0';
      K[4] = '\0';
      K[5] = '\0';
      K[6] = '\0';
      K[7] = '\0';
      K[8] = '\0';
      K[9] = '\0';
      K[10] = '\0';
      K[0xb] = '\0';
      K[0xc] = '\0';
      K[0xd] = '\0';
      K[0xe] = '\0';
      K[0xf] = '\0';
      pEStack_1f0 = (EVP_MD *)0x10247c;
      pEVar7 = EVP_get_digestbyname(pcVar10);
      uVar3 = 1;
      if (pEVar7 == (EVP_MD *)0x0) {
        pEStack_1f0 = (EVP_MD *)0x102511;
        pEVar8 = (EVP_MD *)EVP_MAC_fetch(0,pcVar10,0);
        pEVar7 = pEVar15;
        if (pEVar8 == (EVP_MD *)0x0) {
LAB_001027ea:
          pEVar15 = pEVar19;
          pEVar8 = unaff_R12;
          pEStack_1f0 = (EVP_MD *)0x1027f9;
          ERR_print_errors_fp(_stderr);
          pEStack_1f0 = (EVP_MD *)0x102811;
          OPENSSL_die("mac = EVP_MAC_fetch(NULL, name, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0x105);
LAB_00102811:
          pEStack_1f0 = (EVP_MD *)0x102820;
          ERR_print_errors_fp(_stderr);
          pEStack_1f0 = (EVP_MD *)0x102838;
          OPENSSL_die("EVP_MAC_final(ctx, c, &tmplen, sizeof(c))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0x11f);
LAB_00102838:
          pEStack_1f0 = (EVP_MD *)0x102847;
          ERR_print_errors_fp(_stderr);
          pEStack_1f0 = (EVP_MD *)0x10285f;
          OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0x119);
          pEVar19 = pEVar15;
          pcVar9 = pcVar10;
LAB_0010285f:
          pEStack_1f0 = (EVP_MD *)0x10286e;
          ERR_print_errors_fp(_stderr);
          pEStack_1f0 = (EVP_MD *)0x102886;
          OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0x118);
          unaff_R12 = pEVar8;
        }
        else {
          pEStack_1f0 = (EVP_MD *)0x10252e;
          printf("\x1b[1;34mMac test for %s\x1b[m\n");
          pEStack_1f0 = (EVP_MD *)0x102542;
          memset(pt,0,0x100);
          pt[0] = '\x01';
          b[0x30] = '\0';
          b[0x31] = '\0';
          b[0x32] = '\0';
          b[0x33] = '\0';
          b[0x34] = '\0';
          b[0x35] = '\0';
          b[0x36] = '\0';
          b[0x37] = '\0';
          b[0x38] = '\0';
          b[0x39] = '\0';
          b[0x3a] = '\0';
          b[0x3b] = '\0';
          b[0x3c] = '\0';
          b[0x3d] = '\0';
          b[0x3e] = '\0';
          b[0x3f] = '\0';
          b[0x20] = '\0';
          b[0x21] = '\0';
          b[0x22] = '\0';
          b[0x23] = '\0';
          b[0x24] = '\0';
          b[0x25] = '\0';
          b[0x26] = '\0';
          b[0x27] = '\0';
          b[0x28] = '\0';
          b[0x29] = '\0';
          b[0x2a] = '\0';
          b[0x2b] = '\0';
          b[0x2c] = '\0';
          b[0x2d] = '\0';
          b[0x2e] = '\0';
          b[0x2f] = '\0';
          b[0x10] = '\0';
          b[0x11] = '\0';
          b[0x12] = '\0';
          b[0x13] = '\0';
          b[0x14] = '\0';
          b[0x15] = '\0';
          b[0x16] = '\0';
          b[0x17] = '\0';
          b[0x18] = '\0';
          b[0x19] = '\0';
          b[0x1a] = '\0';
          b[0x1b] = '\0';
          b[0x1c] = '\0';
          b[0x1d] = '\0';
          b[0x1e] = '\0';
          b[0x1f] = '\0';
          b[0] = '\0';
          b[1] = '\0';
          b[2] = '\0';
          b[3] = '\0';
          b[4] = '\0';
          b[5] = '\0';
          b[6] = '\0';
          b[7] = '\0';
          b[8] = '\0';
          b[9] = '\0';
          b[10] = '\0';
          b[0xb] = '\0';
          b[0xc] = '\0';
          b[0xd] = '\0';
          b[0xe] = '\0';
          b[0xf] = '\0';
          c[0x30] = '\0';
          c[0x31] = '\0';
          c[0x32] = '\0';
          c[0x33] = '\0';
          c[0x34] = '\0';
          c[0x35] = '\0';
          c[0x36] = '\0';
          c[0x37] = '\0';
          c[0x38] = '\0';
          c[0x39] = '\0';
          c[0x3a] = '\0';
          c[0x3b] = '\0';
          c[0x3c] = '\0';
          c[0x3d] = '\0';
          c[0x3e] = '\0';
          c[0x3f] = '\0';
          c[0x20] = '\0';
          c[0x21] = '\0';
          c[0x22] = '\0';
          c[0x23] = '\0';
          c[0x24] = '\0';
          c[0x25] = '\0';
          c[0x26] = '\0';
          c[0x27] = '\0';
          c[0x28] = '\0';
          c[0x29] = '\0';
          c[0x2a] = '\0';
          c[0x2b] = '\0';
          c[0x2c] = '\0';
          c[0x2d] = '\0';
          c[0x2e] = '\0';
          c[0x2f] = '\0';
          c[0x10] = '\0';
          c[0x11] = '\0';
          c[0x12] = '\0';
          c[0x13] = '\0';
          c[0x14] = '\0';
          c[0x15] = '\0';
          c[0x16] = '\0';
          c[0x17] = '\0';
          c[0x18] = '\0';
          c[0x19] = '\0';
          c[0x1a] = '\0';
          c[0x1b] = '\0';
          c[0x1c] = '\0';
          c[0x1d] = '\0';
          c[0x1e] = '\0';
          c[0x1f] = '\0';
          c[0] = '\0';
          c[1] = '\0';
          c[2] = '\0';
          c[3] = '\0';
          c[4] = '\0';
          c[5] = '\0';
          c[6] = '\0';
          c[7] = '\0';
          c[8] = '\0';
          c[9] = '\0';
          c[10] = '\0';
          c[0xb] = '\0';
          c[0xc] = '\0';
          c[0xd] = '\0';
          c[0xe] = '\0';
          c[0xf] = '\0';
          pEStack_1f0 = (EVP_MD *)0x102586;
          pcVar9 = (char *)EVP_MAC_CTX_new(pEVar8);
          if (pcVar9 == (char *)0x0) {
LAB_001027c3:
            pEStack_1f0 = (EVP_MD *)0x1027d2;
            ERR_print_errors_fp(_stderr);
            pEStack_1f0 = (EVP_MD *)0x1027ea;
            OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                        ,0x110);
            pEVar19 = pEVar8;
            goto LAB_001027ea;
          }
          pEStack_1f0 = (EVP_MD *)0x1025a4;
          iVar5 = EVP_MAC_init(pcVar9,K,0x20,0);
          pcVar10 = pcVar9;
          if (iVar5 == 0) {
LAB_0010279c:
            pEStack_1f0 = (EVP_MD *)0x1027ab;
            ERR_print_errors_fp(_stderr);
            pEStack_1f0 = (EVP_MD *)0x1027c3;
            OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                        ,0x111);
            goto LAB_001027c3;
          }
          pEStack_1f0 = (EVP_MD *)0x1025c1;
          iVar5 = EVP_MAC_update(pcVar9,pt,0x100);
          if (iVar5 == 0) {
LAB_00102775:
            pEStack_1f0 = (EVP_MD *)0x102784;
            ERR_print_errors_fp(_stderr);
            pEStack_1f0 = (EVP_MD *)0x10279c;
            OPENSSL_die("EVP_MAC_update(ctx, pt, sizeof(pt))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                        ,0x112);
            goto LAB_0010279c;
          }
          pEStack_1f0 = (EVP_MD *)0x1025de;
          iVar5 = EVP_MAC_final(pcVar9,b,local_1e0);
          pEVar19 = pEVar8;
          if (iVar5 != 0) {
            pEStack_1f0 = (EVP_MD *)0x1025ee;
            EVP_MAC_CTX_free(pcVar9);
            pEStack_1f0 = (EVP_MD *)0x1025fc;
            printf(" cloned contexts: ");
            pEStack_1f0 = (EVP_MD *)0x102607;
            pcVar10 = (char *)EVP_MAC_CTX_new(pEVar8);
            if (pcVar10 != (char *)0x0) {
              pEStack_1f0 = (EVP_MD *)0x102628;
              iVar5 = EVP_MAC_init(pcVar10,K,0x20);
              if (iVar5 != 0) {
                lVar11 = 0;
                while (pEVar7 = (EVP_MD *)(lVar11 + 0x10), unaff_R12 = pEVar8,
                      pEVar7 != (EVP_MD *)0x110) {
                  pEStack_1f0 = (EVP_MD *)0x102655;
                  iVar5 = EVP_MAC_update(pcVar10,pt + lVar11,0x10);
                  lVar11 = (long)pEVar7;
                  if (iVar5 == 0) {
                    pEStack_1f0 = (EVP_MD *)0x10275d;
                    ERR_print_errors_fp(_stderr);
                    pEStack_1f0 = (EVP_MD *)0x102775;
                    OPENSSL_die("EVP_MAC_update(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                                ,0x11c);
                    pEVar8 = pEVar15;
                    goto LAB_00102775;
                  }
                }
                pEVar7 = (EVP_MD *)0x40;
                pEStack_1f0 = (EVP_MD *)0x102677;
                iVar5 = EVP_MAC_final(pcVar10,c,local_1e0);
                if (iVar5 != 0) {
                  pEStack_1f0 = (EVP_MD *)0x102687;
                  EVP_MAC_CTX_free(pcVar10);
                  pEStack_1f0 = (EVP_MD *)0x10268f;
                  EVP_MAC_free(pEVar8);
                  pEStack_1f0 = (EVP_MD *)0x1026a2;
                  iVar5 = bcmp(c,b,0x40);
                  pEVar7 = pEVar15;
                  if (iVar5 == 0) {
                    pEStack_1f0 = (EVP_MD *)0x102706;
                    puts("\x1b[1;32m  Test passed\x1b[m");
                    uVar3 = 0;
                  }
                  else {
                    pEStack_1f0 = (EVP_MD *)0x1026b5;
                    puts("\x1b[1;31m  Test FAILED\x1b[m");
                    pEStack_1f0 = (EVP_MD *)0x1026c8;
                    printf("  b[%d] = ",0x100);
                    pEStack_1f0 = (EVP_MD *)0x1026d5;
                    hexdump(b,0x100);
                    pEStack_1f0 = (EVP_MD *)0x1026e8;
                    printf("  c[%d] = ",0x100);
                    pEStack_1f0 = (EVP_MD *)0x1026f5;
                    hexdump(c,0x100);
                  }
                  goto LAB_00102709;
                }
                goto LAB_00102811;
              }
              goto LAB_00102838;
            }
            goto LAB_0010285f;
          }
        }
        pEStack_1f0 = (EVP_MD *)0x102895;
        ERR_print_errors_fp(_stderr);
        pEStack_1f0 = (EVP_MD *)0x1028ad;
        OPENSSL_die("EVP_MAC_final(ctx, b, &tmplen, sizeof(b))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x113);
        pEVar15 = pEVar7;
        pcVar10 = pcVar9;
LAB_001028ad:
        pEStack_1f0 = (EVP_MD *)0x1028bc;
        ERR_print_errors_fp(_stderr);
        pcVar9 = 
        "(type = (EVP_MD *)EVP_get_digestbyname(name)) || (type = EVP_MD_fetch(NULL, name, NULL))";
        iVar5 = 0x104104;
        pEStack_1f0 = (EVP_MD *)test_contexts_cipher;
        OPENSSL_die("(type = (EVP_MD *)EVP_get_digestbyname(name)) || (type = EVP_MD_fetch(NULL, name, NULL))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0xf0);
        puVar14 = &uStack_590;
        uStack_598 = 0x102904;
        puStack_218 = c;
        pEStack_210 = unaff_R12;
        ptStack_208 = ptVar17;
        pEStack_200 = pEVar19;
        pcStack_1f8 = pcVar10;
        pEStack_1f0 = pEVar15;
        memset(auStack_320,0,0x100);
        auStack_320[0] = '\x01';
        auStack_580[0x20] = '\0';
        auStack_580[0x21] = '\0';
        auStack_580[0x22] = '\0';
        auStack_580[0x23] = '\0';
        auStack_580[0x24] = '\0';
        auStack_580[0x25] = '\0';
        auStack_580[0x26] = '\0';
        auStack_580[0x27] = '\0';
        auStack_580[0x28] = '\0';
        auStack_580[0x29] = '\0';
        auStack_580[0x2a] = '\0';
        auStack_580[0x2b] = '\0';
        auStack_580[0x2c] = '\0';
        auStack_580[0x2d] = '\0';
        auStack_580[0x2e] = '\0';
        auStack_580[0x2f] = '\0';
        auStack_580[0x10] = '\x01';
        auStack_580[0x11] = '\0';
        auStack_580[0x12] = '\0';
        auStack_580[0x13] = '\0';
        auStack_580[0x14] = '\0';
        auStack_580[0x15] = '\0';
        auStack_580[0x16] = '\0';
        auStack_580[0x17] = '\0';
        auStack_580[0x18] = '\0';
        auStack_580[0x19] = '\0';
        auStack_580[0x1a] = '\0';
        auStack_580[0x1b] = '\0';
        auStack_580[0x1c] = '\0';
        auStack_580[0x1d] = '\0';
        auStack_580[0x1e] = '\0';
        auStack_580[0x1f] = '\0';
        auStack_580[0] = '\x01';
        auStack_580[1] = '\0';
        auStack_580[2] = '\0';
        auStack_580[3] = '\0';
        auStack_580[4] = '\0';
        auStack_580[5] = '\0';
        auStack_580[6] = '\0';
        auStack_580[7] = '\0';
        auStack_580[8] = '\0';
        auStack_580[9] = '\0';
        auStack_580[10] = '\0';
        auStack_580[0xb] = '\0';
        auStack_580[0xc] = '\0';
        auStack_580[0xd] = '\0';
        auStack_580[0xe] = '\0';
        auStack_580[0xf] = '\0';
        uStack_598 = 0x102930;
        ERR_set_mark();
        uStack_598 = 0x102938;
        cipher = EVP_get_cipherbyname(pcVar9);
        if (cipher == (EVP_CIPHER *)0x0) {
          uStack_598 = 0x102949;
          cipher = (EVP_CIPHER *)EVP_CIPHER_fetch(0,pcVar9,0);
          if (cipher == (EVP_CIPHER *)0x0) {
            uStack_598 = 0x10303e;
            ERR_print_errors_fp(_stderr);
            pcVar10 = 
            "(type = (EVP_CIPHER *)EVP_get_cipherbyname(name)) || (type = EVP_CIPHER_fetch(NULL, name, NULL))"
            ;
            puVar13 = &uStack_598;
            uStack_598 = 0x46;
            goto LAB_00102e9d;
          }
        }
        uStack_598 = 0x10295a;
        ERR_pop_to_mark();
        pcVar10 = "Encryption";
        if (iVar5 == 0) {
          pcVar10 = "Decryption";
        }
        uStack_598 = 0x102980;
        printf("\x1b[1;34m%s test for %s\x1b[m\n",pcVar10,pcVar9);
        uStack_598 = 0x102985;
        ctx = EVP_CIPHER_CTX_new();
        if (ctx == (EVP_CIPHER_CTX *)0x0) goto LAB_00102ea3;
        uStack_598 = 0x1029ab;
        iVar6 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,auStack_580 + 0x10,auStack_580,iVar5);
        if (iVar6 == 0) {
          uStack_598 = 0x102ed3;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)";
          puVar13 = &uStack_598;
          uStack_598 = 0x4f;
          goto LAB_00102e9d;
        }
        pEVar18 = (EVP_CIPHER *)(long)arg;
        if (arg != 0) {
          uStack_598 = 0x1029c6;
          lVar11 = EVP_CIPHER_get0_provider(cipher);
          if (lVar11 == 0) {
            uStack_598 = 0x102a5f;
            iVar6 = EVP_CIPHER_CTX_ctrl(ctx,0x20,arg,(void *)0x0);
            if (iVar6 == 0) {
              uStack_598 = 0x103062;
              ERR_print_errors_fp(_stderr);
              pcVar10 = "EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)";
              puVar13 = &uStack_598;
              uStack_598 = 0x58;
              goto LAB_00102e9d;
            }
          }
          else {
            uStack_3e0 = 0;
            uStack_3d8 = 0;
            uStack_3f0 = 0;
            uStack_3e8 = 0;
            uStack_400 = 0;
            uStack_3f8 = 0;
            auStack_420[0x10] = '\0';
            auStack_420[0x11] = '\0';
            auStack_420[0x12] = '\0';
            auStack_420[0x13] = '\0';
            auStack_420[0x14] = '\0';
            auStack_420[0x15] = '\0';
            auStack_420[0x16] = '\0';
            auStack_420[0x17] = '\0';
            auStack_420[0x18] = '\0';
            auStack_420[0x19] = '\0';
            auStack_420[0x1a] = '\0';
            auStack_420[0x1b] = '\0';
            auStack_420[0x1c] = '\0';
            auStack_420[0x1d] = '\0';
            auStack_420[0x1e] = '\0';
            auStack_420[0x1f] = '\0';
            auStack_420[0] = '\0';
            auStack_420[1] = '\0';
            auStack_420[2] = '\0';
            auStack_420[3] = '\0';
            auStack_420[4] = '\0';
            auStack_420[5] = '\0';
            auStack_420[6] = '\0';
            auStack_420[7] = '\0';
            auStack_420[8] = '\0';
            auStack_420[9] = '\0';
            auStack_420[10] = '\0';
            auStack_420[0xb] = '\0';
            auStack_420[0xc] = '\0';
            auStack_420[0xd] = '\0';
            auStack_420[0xe] = '\0';
            auStack_420[0xf] = '\0';
            uStack_598 = 0x102a18;
            pEStack_588 = pEVar18;
            uStack_548 = pEVar18;
            OSSL_PARAM_construct_size_t(&uStack_520,"key-mesh");
            uStack_400 = uStack_500;
            uStack_598 = 0x102a41;
            iVar6 = EVP_CIPHER_CTX_set_params(ctx);
            pEVar18 = pEStack_588;
            if (iVar6 == 0) goto LAB_0010300b;
          }
        }
        uStack_598 = 0x102a71;
        iVar6 = EVP_CIPHER_CTX_set_padding(ctx,0);
        if (iVar6 == 0) {
          uStack_598 = 0x102ef4;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CIPHER_CTX_set_padding(ctx, 0)";
          puVar13 = &uStack_598;
          uStack_598 = 0x5b;
          goto LAB_00102e9d;
        }
        uStack_598 = 0x102a9a;
        iVar6 = EVP_CipherUpdate(ctx,auStack_420,(int *)&uStack_590,auStack_320,0x100);
        if (iVar6 == 0) {
          uStack_598 = 0x102f15;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b))";
          puVar13 = &uStack_598;
          uStack_598 = 0x5c;
          goto LAB_00102e9d;
        }
        uStack_598 = 0x102abe;
        iVar6 = EVP_CipherFinal_ex(ctx,auStack_420 + (int)uStack_590,&iStack_58c);
        if (iVar6 == 0) {
          uStack_598 = 0x102f39;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CipherFinal_ex(ctx, b + outlen, &tmplen)";
          puVar13 = &uStack_598;
          uStack_598 = 0x5d;
          goto LAB_00102e9d;
        }
        uStack_598 = 0x102ace;
        EVP_CIPHER_CTX_reset(ctx);
        uStack_598 = 0x102ad6;
        EVP_CIPHER_CTX_reset(ctx);
        uStack_598 = 0x102af0;
        iVar5 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,auStack_580 + 0x10,auStack_580,iVar5);
        if (iVar5 == 0) {
          uStack_598 = 0x102f5d;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)";
          puVar13 = &uStack_598;
          uStack_598 = 0x62;
          goto LAB_00102e9d;
        }
        uStack_598 = 0x102b02;
        iVar5 = EVP_CIPHER_CTX_set_padding(ctx,0);
        if (iVar5 == 0) {
          uStack_598 = 0x102f81;
          ERR_print_errors_fp(_stderr);
          pcVar10 = "EVP_CIPHER_CTX_set_padding(ctx, 0)";
          puVar13 = &uStack_598;
          uStack_598 = 99;
          goto LAB_00102e9d;
        }
        if (arg != 0) {
          uStack_598 = 0x102b1a;
          lVar11 = EVP_CIPHER_get0_provider(cipher);
          if (lVar11 == 0) {
            uStack_598 = 0x102bb5;
            iVar5 = EVP_CIPHER_CTX_ctrl(ctx,0x20,arg,(void *)0x0);
            if (iVar5 == 0) {
              uStack_598 = 0x103086;
              ERR_print_errors_fp(_stderr);
              pcVar10 = "EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)";
              puVar13 = &uStack_598;
              uStack_598 = 0x6c;
              goto LAB_00102e9d;
            }
          }
          else {
            uStack_4e0 = 0;
            uStack_4d8 = 0;
            uStack_4f0 = 0;
            uStack_4e8 = 0;
            uStack_500 = 0;
            uStack_4f8 = 0;
            uStack_598 = 0x102b56;
            pEStack_550 = pEVar18;
            OSSL_PARAM_construct_size_t(&uStack_548,"key-mesh");
            uStack_500 = uStack_528;
            uStack_510 = uStack_538;
            uStack_50c = uStack_534;
            uStack_508 = uStack_530;
            uStack_504 = uStack_52c;
            uStack_520 = (undefined4)uStack_548;
            uStack_51c = uStack_548._4_4_;
            uStack_518 = uStack_540;
            uStack_514 = uStack_53c;
            uStack_598 = 0x102b7e;
            iVar5 = EVP_CIPHER_CTX_set_params(ctx);
            if (iVar5 == 0) {
              uStack_598 = 0x102b91;
              ERR_print_errors_fp(_stderr);
              pcVar10 = "EVP_CIPHER_CTX_set_params(ctx, params)";
              puVar13 = &uStack_598;
              uStack_598 = 0x6a;
              goto LAB_00102e9d;
            }
          }
        }
        uStack_598 = 0x102bd6;
        pEStack_588 = cipher;
        printf(" cloned contexts: ");
        uStack_598 = 0x102be7;
        memset(&uStack_520,0,0x100);
        lVar11 = 0;
        ctx_00 = ctx;
        break;
      }
      pEStack_1f0 = (EVP_MD *)0x102499;
      printf("\x1b[1;34mMac via EVP_MD test for %s\x1b[m\n",pcVar10);
      pEStack_1f0 = (EVP_MD *)0x1024a3;
      uVar3 = test_contexts_digest_or_legacy_mac((EVP_MD *)pEVar7,1);
    }
LAB_00102709:
    local_1e8 = (ulong)((uint)local_1e8 | uVar3);
    ptVar17 = ptVar17 + 1;
    pEVar19 = pEVar7;
  } while( true );
  while( true ) {
    uStack_598 = 0x102c16;
    iVar5 = EVP_CIPHER_CTX_copy(out,ctx_00);
    if (iVar5 == 0) {
      uStack_598 = 0x102e8d;
      ERR_print_errors_fp(_stderr);
      pcVar10 = "EVP_CIPHER_CTX_copy(copy, ctx)";
      puVar13 = &uStack_598;
      uStack_598 = 0x77;
      goto LAB_00102e9d;
    }
    if (ctx != ctx_00) {
      uStack_598 = 0x102c2b;
      EVP_CIPHER_CTX_free(ctx_00);
    }
    uStack_598 = 0x102c49;
    iVar5 = EVP_CipherUpdate(out,(uchar *)((long)&uStack_520 + lVar11),(int *)&uStack_590,
                             auStack_320 + lVar11,0x10);
    lVar11 = lVar11 + 0x10;
    ctx_00 = out;
    if (iVar5 == 0) break;
    if (lVar11 + 0x10 == 0x110) {
      uStack_590 = 0x100;
      uStack_598 = 0x102c93;
      iVar5 = EVP_CipherFinal_ex(ctx_00,auStack_420,&iStack_58c);
      if (iVar5 == 0) {
        uStack_598 = 0x102fa5;
        ERR_print_errors_fp(_stderr);
        uStack_598 = 0x102fbd;
        OPENSSL_die("EVP_CipherFinal_ex(ctx, c + outlen, &tmplen)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x81);
LAB_00102fbd:
        uStack_598 = 0x102fcc;
        ERR_print_errors_fp(_stderr);
        uStack_598 = 0x102fe4;
        OPENSSL_die("EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x8f);
      }
      else {
        uVar3 = 1;
        pcVar10 = "\x1b[1;31m  Test FAILED\x1b[m";
        if (uStack_590 == 0x100) {
          uStack_598 = 0x102cc6;
          iVar5 = bcmp(&uStack_520,auStack_420,0x100);
          bVar2 = false;
          if (iVar5 == 0) {
            bVar2 = true;
            pcVar10 = "\x1b[1;32m  Test passed\x1b[m";
            uVar3 = 0;
          }
        }
        else {
          bVar2 = false;
        }
        uStack_598 = 0x102ce4;
        puts(pcVar10);
        uStack_598 = 0x102cec;
        EVP_CIPHER_CTX_free(ctx_00);
        if (!bVar2) {
          uStack_598 = 0x102d01;
          printf("  b[%d] = ",(ulong)uStack_590);
          uStack_598 = 0x102d12;
          hexdump(auStack_420,(long)(int)uStack_590);
          uStack_598 = 0x102d23;
          printf("  c[%d] = ",(ulong)uStack_590);
          uStack_598 = 0x102d31;
          hexdump(&uStack_520,(long)(int)uStack_590);
        }
        uStack_598 = 0x102d3f;
        printf("    base context: ");
        uStack_598 = 0x102d53;
        memset(&uStack_520,0,0x100);
        uStack_598 = 0x102d6f;
        iVar5 = EVP_CipherUpdate(ctx,(uchar *)&uStack_520,(int *)&uStack_590,auStack_320,0x100);
        if (iVar5 == 0) goto LAB_00102fbd;
        uStack_598 = 0x102d90;
        iVar5 = EVP_CipherFinal_ex(ctx,(uchar *)((long)&uStack_520 + (long)(int)uStack_590),
                                   &iStack_58c);
        if (iVar5 != 0) {
          uVar4 = 1;
          pcVar10 = "\x1b[1;31m  Test FAILED\x1b[m";
          if (uStack_590 == 0x100) {
            uStack_598 = 0x102dc2;
            iVar5 = bcmp(&uStack_520,auStack_420,0x100);
            bVar2 = false;
            if (iVar5 == 0) {
              bVar2 = true;
              pcVar10 = "\x1b[1;32m  Test passed\x1b[m";
              uVar4 = 0;
            }
          }
          else {
            bVar2 = false;
          }
          uStack_598 = 0x102ddf;
          puts(pcVar10);
          uStack_598 = 0x102de7;
          EVP_CIPHER_CTX_reset(ctx);
          uStack_598 = 0x102def;
          EVP_CIPHER_CTX_reset(ctx);
          uStack_598 = 0x102df7;
          EVP_CIPHER_CTX_free(ctx);
          uStack_598 = 0x102e01;
          EVP_CIPHER_free(pEStack_588);
          if (!bVar2) {
            uStack_598 = 0x102e16;
            printf("  b[%d] = ",(ulong)uStack_590);
            uStack_598 = 0x102e27;
            hexdump(auStack_420,(long)(int)uStack_590);
            uStack_598 = 0x102e38;
            printf("  c[%d] = ",(ulong)uStack_590);
            uStack_598 = 0x102e46;
            hexdump(&uStack_520,(long)(int)uStack_590);
          }
          return uVar4 | uVar3;
        }
      }
      uStack_598 = 0x102ff3;
      ERR_print_errors_fp(_stderr);
      uStack_598 = 0x10300b;
      OPENSSL_die("EVP_CipherFinal_ex(save, c + outlen, &tmplen)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x90);
LAB_0010300b:
      uStack_598 = 0x10301a;
      ERR_print_errors_fp(_stderr);
      pcVar10 = "EVP_CIPHER_CTX_set_params(ctx, params)";
      puVar13 = &uStack_598;
      uStack_598 = 0x56;
      goto LAB_00102e9d;
    }
    uStack_598 = 0x102bff;
    out = EVP_CIPHER_CTX_new();
    if (out == (EVP_CIPHER_CTX *)0x0) {
      uStack_598 = 0x102e6c;
      ERR_print_errors_fp(_stderr);
      pcVar10 = "copy";
      puVar13 = &uStack_598;
      uStack_598 = 0x76;
      goto LAB_00102e9d;
    }
  }
  uStack_598 = 0x102c62;
  ERR_print_errors_fp(_stderr);
  pcVar10 = "EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen, pt + STEP_SIZE * i, STEP_SIZE)";
  puVar13 = &uStack_598;
  uStack_598 = 0x7d;
LAB_00102e9d:
  do {
    uVar1 = *puVar13;
    puVar14 = (uint *)(puVar13 + 1);
    *puVar13 = 0x102ea3;
    OPENSSL_die(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,uVar1);
LAB_00102ea3:
    *(undefined8 *)((long)puVar14 + -8) = 0x102eb2;
    ERR_print_errors_fp(_stderr);
    pcVar10 = "ctx";
    puVar13 = (undefined8 *)((long)puVar14 + -8);
    *(undefined8 *)((long)puVar14 + -8) = 0x4e;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    const struct testcase_cipher *tc;
    for (tc = testcases_ciphers; tc->name; tc++) {
	ret |= test_contexts_cipher(tc->name, 1, tc->acpkm);
	ret |= test_contexts_cipher(tc->name, 0, tc->acpkm);
    }
    const struct testcase_digest *td;
    for (td = testcases_digests; td->name; td++) {
        if (td->mac)
            ret |= test_contexts_mac(td->name);
        else
            ret |= test_contexts_digest(td->name);
    }

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}